

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update3
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                eps2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int rn2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec3,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                eps3,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs3,int *ridx3,int rn3,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  bool bVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  undefined8 uVar5;
  int *piVar6;
  int *piVar7;
  undefined8 uVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  undefined8 vec_01;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  undefined4 uVar17;
  long lVar18;
  int *piVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  undefined4 in_stack_00000064;
  cpp_dec_float<50U,_int,_void> local_398;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_360;
  int *local_358;
  int local_34c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int *local_300;
  cpp_dec_float<50U,_int,_void> local_2e8;
  cpp_dec_float<50U,_int,_void> local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  piVar19 = (int *)eps2.m_backend.data._M_elems._16_8_;
  local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_68.m_backend.exp = (eps->m_backend).exp;
  local_68.m_backend.neg = (eps->m_backend).neg;
  local_68.m_backend.fpclass = (eps->m_backend).fpclass;
  local_68.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_a8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_a8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_a8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_a8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_a8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
  local_a8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend._40_8_ + 0x20);
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend._40_8_;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend._40_8_ + 8);
  local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend._40_8_ + 0x10);
  local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend._40_8_ + 0x18);
  local_e8.m_backend.exp = *(int *)(eps2.m_backend._40_8_ + 0x28);
  local_e8.m_backend.neg = *(bool *)(eps2.m_backend._40_8_ + 0x2c);
  local_e8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend._40_8_ + 0x30);
  local_360 = rhs;
  local_358 = idx;
  vSolveLright3(this,rhs,ridx,&rn,&local_68,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._8_8_,(int *)eps2.m_backend.data._M_elems._16_8_,
                (int *)(eps2.m_backend.data._M_elems + 6),&local_a8,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend._48_8_,(int *)rhs2,(int *)&ridx2,&local_e8);
  if (CONCAT44(in_stack_00000064,rn2) == 0) {
    if (rn < 1) {
      uVar20 = 0;
    }
    else {
      piVar6 = (this->row).perm;
      lVar21 = 0;
      uVar14 = 0;
      do {
        uVar20 = (uint)uVar14;
        iVar10 = ridx[lVar21];
        local_398.exp = local_360[iVar10].m_backend.exp;
        local_398.neg = local_360[iVar10].m_backend.neg;
        uVar5 = *(undefined8 *)(local_360[iVar10].m_backend.data._M_elems + 8);
        local_398.data._M_elems._32_5_ = SUB85(uVar5,0);
        local_398.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_398.data._M_elems._0_8_ = *(undefined8 *)local_360[iVar10].m_backend.data._M_elems;
        local_398.data._M_elems._8_8_ =
             *(undefined8 *)(local_360[iVar10].m_backend.data._M_elems + 2);
        puVar1 = local_360[iVar10].m_backend.data._M_elems + 4;
        local_398.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 2);
        local_398.data._M_elems._24_5_ = SUB85(uVar5,0);
        local_398.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_398.fpclass = local_360[iVar10].m_backend.fpclass;
        local_398.prec_elem = local_360[iVar10].m_backend.prec_elem;
        local_2e8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_2e8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_2e8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_2e8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_2e8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_2e8.exp = (eps->m_backend).exp;
        local_2e8.neg = (eps->m_backend).neg;
        local_2e8.fpclass = (eps->m_backend).fpclass;
        local_2e8.prec_elem = (eps->m_backend).prec_elem;
        if ((local_398.neg == true) &&
           (local_398.data._M_elems[0] != 0 || local_398.fpclass != cpp_dec_float_finite)) {
          local_398.neg = false;
        }
        if (local_2e8.fpclass == cpp_dec_float_NaN || local_398.fpclass == cpp_dec_float_NaN) {
LAB_0028c9b8:
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&local_360[iVar10].m_backend,0);
        }
        else {
          iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_398,&local_2e8);
          if (iVar9 < 1) goto LAB_0028c9b8;
          iVar10 = piVar6[iVar10];
          uVar13 = uVar20;
          if (0 < (int)uVar20) {
            do {
              uVar15 = (uint)uVar14 - 1;
              uVar11 = uVar15 >> 1;
              uVar13 = (uint)uVar14;
              if (iVar10 <= ridx[uVar11]) break;
              ridx[uVar14] = ridx[uVar11];
              uVar14 = (ulong)uVar11;
              uVar13 = uVar11;
            } while (1 < uVar15);
          }
          uVar14 = (ulong)(uVar20 + 1);
          ridx[(int)uVar13] = iVar10;
        }
        lVar21 = lVar21 + 1;
        uVar20 = (int)uVar14;
      } while (lVar21 < rn);
    }
  }
  else {
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    if (rn < 1) {
      uVar20 = 0;
    }
    else {
      local_300 = (int *)eps3.m_backend.data._M_elems._0_8_;
      piVar19 = (this->row).perm;
      lVar21 = 0;
      uVar20 = 0;
      do {
        iVar10 = ridx[lVar21];
        lVar18 = (long)iVar10;
        lVar22 = lVar18 * 0x38;
        result.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(local_360[lVar18].m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._0_16_ =
             *(undefined1 (*) [16])local_360[lVar18].m_backend.data._M_elems;
        result.m_backend.data._M_elems._16_16_ =
             *(undefined1 (*) [16])(local_360[lVar18].m_backend.data._M_elems + 4);
        local_398.exp = local_360[lVar18].m_backend.exp;
        bVar2 = local_360[lVar18].m_backend.neg;
        fVar3 = local_360[lVar18].m_backend.fpclass;
        iVar4 = local_360[lVar18].m_backend.prec_elem;
        uVar5 = *(undefined8 *)(local_360[lVar18].m_backend.data._M_elems + 8);
        local_398.data._M_elems._32_5_ = SUB85(uVar5,0);
        local_398.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_398.data._M_elems._0_8_ = *(undefined8 *)local_360[lVar18].m_backend.data._M_elems;
        local_398.data._M_elems._8_8_ =
             *(undefined8 *)(local_360[lVar18].m_backend.data._M_elems + 2);
        puVar1 = local_360[lVar18].m_backend.data._M_elems + 4;
        local_398.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 2);
        local_398.data._M_elems._24_5_ = SUB85(uVar5,0);
        local_398.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_2a8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_2a8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_2a8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_2a8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_2a8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_2a8.exp = (eps->m_backend).exp;
        local_2a8.neg = (eps->m_backend).neg;
        local_2a8.fpclass = (eps->m_backend).fpclass;
        local_2a8.prec_elem = (eps->m_backend).prec_elem;
        local_398.prec_elem = iVar4;
        local_398.fpclass = fVar3;
        local_398.neg = bVar2;
        if ((bVar2 == true) && (local_398.data._M_elems[0] != 0 || fVar3 != cpp_dec_float_finite)) {
          local_398.neg = false;
        }
        if (local_2a8.fpclass == cpp_dec_float_NaN || fVar3 == cpp_dec_float_NaN) {
LAB_0028c7d8:
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&local_360[lVar18].m_backend,0);
        }
        else {
          local_34c = local_398.exp;
          iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_398,&local_2a8);
          if (iVar9 < 1) goto LAB_0028c7d8;
          *local_300 = iVar10;
          iVar10 = piVar19[lVar18];
          uVar13 = uVar20;
          if (0 < (int)uVar20) {
            do {
              uVar11 = uVar13 - 1;
              uVar15 = uVar11 >> 1;
              if (iVar10 <= ridx[uVar15]) break;
              ridx[uVar13] = ridx[uVar15];
              uVar13 = uVar15;
            } while (1 < uVar11);
          }
          local_300 = local_300 + 1;
          uVar20 = uVar20 + 1;
          ridx[(int)uVar13] = iVar10;
          lVar18 = CONCAT44(in_stack_00000064,rn2);
          *(undefined8 *)(lVar18 + 0x20 + lVar22) = result.m_backend.data._M_elems._32_8_;
          puVar1 = (uint *)(lVar18 + 0x10 + lVar22);
          *(undefined8 *)puVar1 = result.m_backend.data._M_elems._16_8_;
          *(undefined8 *)(puVar1 + 2) = result.m_backend.data._M_elems._24_8_;
          *(undefined8 *)(lVar18 + lVar22) = result.m_backend.data._M_elems._0_8_;
          *(undefined8 *)((uint *)(lVar18 + lVar22) + 2) = result.m_backend.data._M_elems._8_8_;
          *(int *)(lVar18 + 0x28 + lVar22) = local_34c;
          *(bool *)(lVar18 + 0x2c + lVar22) = bVar2;
          *(fpclass_type *)(lVar18 + 0x30 + lVar22) = fVar3;
          *(int32_t *)(lVar18 + 0x34 + lVar22) = iVar4;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 < rn);
    }
    (vec3->m_backend).data._M_elems[0] = uVar20;
    piVar19 = (int *)eps2.m_backend.data._M_elems._16_8_;
  }
  rn = uVar20;
  uVar5 = eps2.m_backend._40_8_;
  piVar6 = ridx2;
  if ((double)(int)eps2.m_backend.data._M_elems[6] <= (double)this->thedim * 0.2) {
    local_398.fpclass = cpp_dec_float_finite;
    local_398.prec_elem = 10;
    local_398.data._M_elems[0] = 0;
    local_398.data._M_elems[1] = 0;
    local_398.data._M_elems[2] = 0;
    local_398.data._M_elems[3] = 0;
    local_398.data._M_elems[4] = 0;
    local_398.data._M_elems[5] = 0;
    local_398.data._M_elems._24_5_ = 0;
    local_398.data._M_elems[7]._1_3_ = 0;
    local_398.data._M_elems._32_5_ = 0;
    local_398.data._M_elems[9]._1_3_ = 0;
    local_398.exp = 0;
    local_398.neg = false;
    if ((int)eps2.m_backend.data._M_elems[6] < 1) {
      uVar20 = 0;
    }
    else {
      piVar7 = (this->row).perm;
      lVar21 = 0;
      uVar14 = 0;
      do {
        uVar20 = (uint)uVar14;
        lVar18 = (long)piVar19[lVar21];
        lVar22 = lVar18 * 0x38;
        uVar8 = *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + 0x20 + lVar22);
        local_398.data._M_elems._32_5_ = SUB85(uVar8,0);
        local_398.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
        local_398.data._M_elems._0_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + lVar22)
        ;
        local_398.data._M_elems._8_8_ =
             *(undefined8 *)((uint *)(eps2.m_backend.data._M_elems._8_8_ + lVar22) + 2);
        puVar1 = (uint *)(eps2.m_backend.data._M_elems._8_8_ + 0x10 + lVar22);
        local_398.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar8 = *(undefined8 *)(puVar1 + 2);
        local_398.data._M_elems._24_5_ = SUB85(uVar8,0);
        local_398.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
        local_398.exp = *(int *)(eps2.m_backend.data._M_elems._8_8_ + 0x28 + lVar22);
        local_398.neg = *(bool *)(eps2.m_backend.data._M_elems._8_8_ + 0x2c + lVar22);
        local_398._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + 0x30 + lVar22);
        result.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
        result.m_backend.data._M_elems._16_16_ =
             *(undefined1 (*) [16])(eps2.m_backend.data._M_elems._0_8_ + 0x10);
        result.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
        result.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
        result.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
        result.m_backend.data._M_elems[0] = (uint)*(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
        if (result.m_backend.data._M_elems[0] != 0 ||
            result.m_backend.fpclass != cpp_dec_float_finite) {
          result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
        }
        result.m_backend.data._M_elems._0_16_ =
             *(undefined1 (*) [16])eps2.m_backend.data._M_elems._0_8_;
        ridx2 = piVar6;
        uVar13 = uVar20;
        if (result.m_backend.fpclass == cpp_dec_float_NaN || local_398.fpclass == cpp_dec_float_NaN)
        {
LAB_0028cb9b:
          if ((local_398.fpclass != cpp_dec_float_NaN) &&
             (*(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x30) != 2)) {
            iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_398,
                                (cpp_dec_float<50U,_int,_void> *)eps2.m_backend.data._M_elems._0_8_)
            ;
            if (0 < iVar10) {
              iVar10 = piVar7[lVar18];
              if (0 < (int)uVar20) {
                do {
                  uVar15 = (uint)uVar14 - 1;
                  uVar11 = uVar15 >> 1;
                  uVar13 = (uint)uVar14;
                  if (iVar10 <= piVar19[uVar11]) break;
                  piVar19[uVar14] = piVar19[uVar11];
                  uVar14 = (ulong)uVar11;
                  uVar13 = uVar11;
                } while (1 < uVar15);
              }
              goto LAB_0028cc51;
            }
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)(lVar22 + eps2.m_backend.data._M_elems._8_8_),
                     0);
          piVar6 = ridx2;
        }
        else {
          iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_398,&result.m_backend);
          if (-1 < iVar10) goto LAB_0028cb9b;
          iVar10 = piVar7[lVar18];
          if (0 < (int)uVar20) {
            do {
              uVar15 = (uint)uVar14 - 1;
              uVar11 = uVar15 >> 1;
              uVar13 = (uint)uVar14;
              if (iVar10 <= piVar19[uVar11]) break;
              piVar19[uVar14] = piVar19[uVar11];
              uVar14 = (ulong)uVar11;
              uVar13 = uVar11;
            } while (1 < uVar15);
          }
LAB_0028cc51:
          uVar14 = (ulong)(uVar20 + 1);
          piVar19[(int)uVar13] = iVar10;
          piVar6 = ridx2;
        }
        lVar21 = lVar21 + 1;
        uVar20 = (uint)uVar14;
      } while (lVar21 < (int)eps2.m_backend.data._M_elems[6]);
    }
  }
  else {
    *piVar19 = this->thedim + -1;
    uVar20 = eps2.m_backend.data._M_elems[6];
  }
  eps2.m_backend.data._M_elems[6] = uVar20;
  ridx2._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
  ridx2._0_4_ = (int)piVar6;
  if ((double)(int)ridx2 <= (double)this->thedim * 0.2) {
    local_398.fpclass = cpp_dec_float_finite;
    local_398.prec_elem = 10;
    local_398.data._M_elems[0] = 0;
    local_398.data._M_elems[1] = 0;
    local_398.data._M_elems[2] = 0;
    local_398.data._M_elems[3] = 0;
    local_398.data._M_elems[4] = 0;
    local_398.data._M_elems[5] = 0;
    local_398.data._M_elems._24_5_ = 0;
    local_398.data._M_elems[7]._1_3_ = 0;
    local_398.data._M_elems._32_5_ = 0;
    local_398.data._M_elems[9]._1_3_ = 0;
    local_398.exp = 0;
    local_398.neg = false;
    if ((int)ridx2 < 1) {
      uVar17 = 0;
    }
    else {
      piVar19 = (this->row).perm;
      lVar21 = 0;
      uVar14 = 0;
      do {
        uVar20 = (uint)uVar14;
        lVar18 = (long)(int)(rhs2->m_backend).data._M_elems[lVar21];
        lVar22 = lVar18 * 0x38;
        uVar8 = *(undefined8 *)(eps2.m_backend._48_8_ + 0x20 + lVar22);
        local_398.data._M_elems._32_5_ = SUB85(uVar8,0);
        local_398.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
        local_398.data._M_elems._0_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + lVar22);
        local_398.data._M_elems._8_8_ =
             *(undefined8 *)((uint *)(eps2.m_backend._48_8_ + lVar22) + 2);
        puVar1 = (uint *)(eps2.m_backend._48_8_ + 0x10 + lVar22);
        local_398.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar8 = *(undefined8 *)(puVar1 + 2);
        local_398.data._M_elems._24_5_ = SUB85(uVar8,0);
        local_398.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
        local_398.exp = *(int *)(eps2.m_backend._48_8_ + 0x28 + lVar22);
        local_398.neg = *(bool *)(eps2.m_backend._48_8_ + 0x2c + lVar22);
        local_398._48_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x30 + lVar22);
        result.m_backend.data._M_elems._32_8_ = *(undefined8 *)(uVar5 + 0x20);
        result.m_backend.data._M_elems._16_16_ = *(undefined1 (*) [16])(uVar5 + 0x10);
        result.m_backend.exp = *(int *)(uVar5 + 0x28);
        result.m_backend.neg = *(bool *)(uVar5 + 0x2c);
        result.m_backend._48_8_ = *(undefined8 *)(uVar5 + 0x30);
        result.m_backend.data._M_elems[0] = (uint)*(undefined8 *)uVar5;
        if (result.m_backend.data._M_elems[0] != 0 ||
            result.m_backend.fpclass != cpp_dec_float_finite) {
          result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
        }
        result.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])uVar5;
        ridx2 = piVar6;
        uVar13 = uVar20;
        if (result.m_backend.fpclass == cpp_dec_float_NaN || local_398.fpclass == cpp_dec_float_NaN)
        {
LAB_0028cdec:
          if ((local_398.fpclass != cpp_dec_float_NaN) && (*(int *)(uVar5 + 0x30) != 2)) {
            iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_398,(cpp_dec_float<50U,_int,_void> *)uVar5);
            if (0 < iVar10) {
              uVar11 = piVar19[lVar18];
              if (0 < (int)uVar20) {
                do {
                  uVar16 = (uint)uVar14 - 1;
                  uVar12 = uVar16 >> 1;
                  uVar15 = (rhs2->m_backend).data._M_elems[uVar12];
                  uVar13 = (uint)uVar14;
                  if ((int)uVar11 <= (int)uVar15) break;
                  (rhs2->m_backend).data._M_elems[uVar14] = uVar15;
                  uVar14 = (ulong)uVar12;
                  uVar13 = uVar12;
                } while (1 < uVar16);
              }
              goto LAB_0028ceb1;
            }
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)(lVar22 + eps2.m_backend._48_8_),0);
          piVar6 = ridx2;
        }
        else {
          iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_398,&result.m_backend);
          if (-1 < iVar10) goto LAB_0028cdec;
          uVar11 = piVar19[lVar18];
          if (0 < (int)uVar20) {
            do {
              uVar16 = (uint)uVar14 - 1;
              uVar12 = uVar16 >> 1;
              uVar15 = (rhs2->m_backend).data._M_elems[uVar12];
              uVar13 = (uint)uVar14;
              if ((int)uVar11 <= (int)uVar15) break;
              (rhs2->m_backend).data._M_elems[uVar14] = uVar15;
              uVar14 = (ulong)uVar12;
              uVar13 = uVar12;
            } while (1 < uVar16);
          }
LAB_0028ceb1:
          uVar14 = (ulong)(uVar20 + 1);
          (rhs2->m_backend).data._M_elems[(int)uVar13] = uVar11;
          piVar6 = ridx2;
        }
        ridx2._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
        ridx2._0_4_ = (int)piVar6;
        uVar17 = (undefined4)uVar14;
        lVar21 = lVar21 + 1;
      } while (lVar21 < (int)ridx2);
    }
    piVar6 = (int *)CONCAT44(ridx2._4_4_,uVar17);
  }
  else {
    (rhs2->m_backend).data._M_elems[0] = this->thedim - 1;
  }
  uVar8 = eps2.m_backend.data._M_elems._0_8_;
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_128.m_backend.exp = (eps->m_backend).exp;
  local_128.m_backend.neg = (eps->m_backend).neg;
  local_128.m_backend.fpclass = (eps->m_backend).fpclass;
  local_128.m_backend.prec_elem = (eps->m_backend).prec_elem;
  ridx2 = piVar6;
  rn = vSolveUright(this,vec,local_358,local_360,ridx,rn,&local_128);
  vec_00 = vec2;
  local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)uVar8;
  local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)(uVar8 + 8);
  local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)(uVar8 + 0x10);
  local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(uVar8 + 0x18);
  local_168.m_backend.data._M_elems._32_8_ = *(undefined8 *)(uVar8 + 0x20);
  local_168.m_backend.exp = *(int *)(uVar8 + 0x28);
  local_168.m_backend.neg = *(bool *)(uVar8 + 0x2c);
  local_168.m_backend._48_8_ = *(undefined8 *)(uVar8 + 0x30);
  vSolveUrightNoNZ(this,vec2,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)eps2.m_backend.data._M_elems._8_8_,(int *)eps2.m_backend.data._M_elems._16_8_,
                   eps2.m_backend.data._M_elems[6],&local_168);
  vec_01 = eps2.m_backend.data._M_elems._32_8_;
  local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)uVar5;
  local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(uVar5 + 8);
  local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)(uVar5 + 0x10);
  local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(uVar5 + 0x18);
  local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(uVar5 + 0x20);
  local_1a8.m_backend.exp = *(int *)(uVar5 + 0x28);
  local_1a8.m_backend.neg = *(bool *)(uVar5 + 0x2c);
  local_1a8.m_backend._48_8_ = *(undefined8 *)(uVar5 + 0x30);
  vSolveUrightNoNZ(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)eps2.m_backend.data._M_elems._32_8_,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)eps2.m_backend._48_8_,(int *)rhs2,(int)ridx2,&local_1a8);
  if ((this->l).updateType == 0) {
    local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_1e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_1e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_1e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_1e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_1e8.m_backend.exp = (eps->m_backend).exp;
    local_1e8.m_backend.neg = (eps->m_backend).neg;
    local_1e8.m_backend.fpclass = (eps->m_backend).fpclass;
    local_1e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
    rn = vSolveUpdateRight(this,vec,local_358,rn,&local_1e8);
    local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)uVar8;
    local_228.m_backend.data._M_elems._8_8_ = *(undefined8 *)(uVar8 + 8);
    local_228.m_backend.data._M_elems._16_8_ = *(undefined8 *)(uVar8 + 0x10);
    local_228.m_backend.data._M_elems._24_8_ = *(undefined8 *)(uVar8 + 0x18);
    local_228.m_backend.data._M_elems._32_8_ = *(undefined8 *)(uVar8 + 0x20);
    local_228.m_backend.exp = *(int *)(uVar8 + 0x28);
    local_228.m_backend.neg = *(bool *)(uVar8 + 0x2c);
    local_228.m_backend._48_8_ = *(undefined8 *)(uVar8 + 0x30);
    vSolveUpdateRightNoNZ(this,vec_00,&local_228);
    local_268.m_backend.data._M_elems._32_8_ = *(undefined8 *)(uVar5 + 0x20);
    local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)uVar5;
    local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)(uVar5 + 8);
    local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)(uVar5 + 0x10);
    local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)(uVar5 + 0x18);
    local_268.m_backend.exp = *(int *)(uVar5 + 0x28);
    local_268.m_backend.neg = *(bool *)(uVar5 + 0x2c);
    local_268.m_backend._48_8_ = *(undefined8 *)(uVar5 + 0x30);
    vSolveUpdateRightNoNZ
              (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)vec_01,&local_268);
  }
  return rn;
}

Assistant:

int CLUFactor<R>::vSolveRight4update3(R eps,
                                      R* vec, int* idx,                 /* result1 */
                                      R* rhs, int* ridx, int rn,        /* rhs1    */
                                      R* vec2, R eps2,               /* result2 */
                                      R* rhs2, int* ridx2, int rn2,     /* rhs2    */
                                      R* vec3, R eps3,               /* result3 */
                                      R* rhs3, int* ridx3, int rn3,     /* rhs3    */
                                      R* forest, int* forestNum, int* forestIdx)
{

   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;
   }

   if(rn3 > thedim * verySparseFactor4right)
   {
      ridx3[0] = thedim - 1;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn3; ++i)
      {
         k = ridx3[i];
         assert(k >= 0 && k < thedim);
         x = rhs3[k];

         if(x < -eps3)
         {
            enQueueMax(ridx3, &j, rperm[k]);
         }
         else if(x > eps3)
         {
            enQueueMax(ridx3, &j, rperm[k]);
         }
         else
            rhs3[k] = 0;
      }

      rn3 = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);
   vSolveUrightNoNZ(vec3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
      vSolveUpdateRightNoNZ(vec3, eps3);
   }

   return rn;
}